

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matcher_test.cc
# Opt level: O3

void __thiscall
cpsm::testing::TestAssertionFailure::~TestAssertionFailure(TestAssertionFailure *this)

{
  pointer pcVar1;
  
  *(undefined ***)this = &PTR__TestAssertionFailure_00111cb8;
  pcVar1 = (this->msg_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->msg_).field_2) {
    operator_delete(pcVar1);
  }
  std::exception::~exception(&this->super_exception);
  operator_delete(this);
  return;
}

Assistant:

TestAssertionFailure() : msg_("test assertion failed") {}